

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

void push_onecapture(MatchState *ms,int i,char *s,char *e)

{
  long lVar1;
  size_t in_RCX;
  char *in_RDX;
  int in_ESI;
  long *in_RDI;
  ptrdiff_t l;
  uint in_stack_fffffffffffffff0;
  
  if (in_ESI < (int)in_RDI[3]) {
    lVar1 = in_RDI[(long)in_ESI * 2 + 5];
    if (lVar1 == -1) {
      luaL_error((lua_State *)in_RDI[2],"unfinished capture");
    }
    if (lVar1 == -2) {
      lua_pushinteger((lua_State *)in_RDI[2],(in_RDI[(long)in_ESI * 2 + 4] - *in_RDI) + 1);
    }
    else {
      lua_pushlstring((lua_State *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_RDX,in_RCX);
    }
  }
  else if (in_ESI == 0) {
    lua_pushlstring((lua_State *)(ulong)in_stack_fffffffffffffff0,in_RDX,in_RCX);
  }
  else {
    luaL_error((lua_State *)in_RDI[2],"invalid capture index");
  }
  return;
}

Assistant:

static void push_onecapture(MatchState*ms,int i,const char*s,
const char*e){
if(i>=ms->level){
if(i==0)
lua_pushlstring(ms->L,s,e-s);
else
luaL_error(ms->L,"invalid capture index");
}
else{
ptrdiff_t l=ms->capture[i].len;
if(l==(-1))luaL_error(ms->L,"unfinished capture");
if(l==(-2))
lua_pushinteger(ms->L,ms->capture[i].init-ms->src_init+1);
else
lua_pushlstring(ms->L,ms->capture[i].init,l);
}
}